

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O1

bool __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvariantOuterTriangleSetTestInstance::
compare(InvariantOuterTriangleSetTestInstance *this,PerPrimitiveVec *primitivesA,
       PerPrimitiveVec *primitivesB,int outerEdgeNdx)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  float fVar3;
  float fVar4;
  TessPrimitiveType TVar5;
  undefined1 auVar6 [16];
  _Link_type p_Var7;
  bool bVar8;
  int i;
  undefined8 *puVar9;
  long lVar10;
  long *plVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  long lVar15;
  _Rb_tree_node_base *p_Var16;
  ulong uVar17;
  Vector<tcu::Vector<float,_3>,_3> *b;
  ulong *puVar18;
  Vector<tcu::Vector<float,_3>,_3> *b_00;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  _Link_type p_Var22;
  _Link_type __x;
  ulong uVar23;
  ulong uVar24;
  float *pfVar25;
  ulong uVar26;
  int iVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  float fVar31;
  Vec3 avg;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  TriangleSet trianglesB;
  TriangleSet trianglesA;
  Triangle triangle;
  long *local_308;
  ulong local_300;
  long local_2f8;
  undefined8 uStack_2f0;
  _Link_type local_2e8;
  _Link_type local_2e0;
  undefined8 local_2d8;
  undefined1 local_2d0 [24];
  _Base_ptr local_2b8;
  ulong local_2b0;
  _Rb_tree_node_base local_2a8;
  _Link_type local_288;
  ulong local_280;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *local_278;
  undefined1 *local_270;
  ulong local_268;
  undefined1 local_260;
  undefined7 uStack_25f;
  vector<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
  local_250;
  string local_238;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_218;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_1e8;
  undefined1 local_1b8 [8];
  undefined4 uStack_1b0;
  float fStack_1ac;
  _Link_type local_1a8;
  _Base_ptr p_Stack_1a0;
  uchar local_198 [4];
  undefined1 local_194 [84];
  ios_base local_140 [272];
  
  TVar5 = (this->super_InvarianceTestInstance).m_caseDef.primitiveType;
  local_2d0._16_8_ = primitivesA;
  if (TVar5 == TESSPRIMITIVETYPE_QUADS) {
    local_2a8._M_left =
         (_Base_ptr)
         ((this->super_InvarianceTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    outerEdgeDescriptions(&local_250,TESSPRIMITIVETYPE_QUADS);
    tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
              (&local_238,
               local_250.
               super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
               ._M_impl.super__Vector_impl_data._M_start + outerEdgeNdx);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,0xb48a65);
    __x = (_Link_type)local_2d0;
    local_2e0 = __x;
    p_Var22 = (_Link_type)(puVar9 + 2);
    if ((_Link_type)*puVar9 == p_Var22) {
      local_2d0._0_8_ = *(long *)&p_Var22->super__Rb_tree_node_base;
      local_2d0._8_8_ = (_Base_ptr)puVar9[3];
    }
    else {
      local_2e0 = (_Link_type)*puVar9;
      local_2d0._0_8_ = *(long *)&p_Var22->super__Rb_tree_node_base;
    }
    p_Var7 = local_2e0;
    local_2d8 = puVar9[1];
    *puVar9 = p_Var22;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_2a8._M_right =
         (_Base_ptr)((long)*(pointer *)(local_2d0._16_8_ + 8) - *(long *)local_2d0._16_8_);
    local_2e8 = (_Link_type)
                ((long)(primitivesB->
                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(primitivesB->
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                      )._M_impl.super__Vector_impl_data._M_start);
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1e8._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1e8._M_t._M_impl._0_1_ = 0;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_218._M_t._M_impl.super__Rb_tree_header._M_header;
    local_218._M_t._M_impl._0_1_ = 0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_218._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar19 = (long)(outerEdgeNdx % 2);
    fVar31 = 0.0;
    if (1 < outerEdgeNdx) {
      fVar31 = 1.0;
    }
    local_288 = (_Link_type)CONCAT44(local_288._4_4_,fVar31);
    iVar27 = 0;
    do {
      p_Var22 = local_2e8;
      if (iVar27 == 0) {
        p_Var22 = (_Link_type)local_2a8._M_right;
      }
      local_278 = &local_218;
      if (iVar27 == 0) {
        local_278 = &local_1e8;
      }
      uVar20 = (uint)((ulong)p_Var22 >> 6);
      if (0 < (int)uVar20) {
        uVar26 = (ulong)(uVar20 & 0x7fffffff);
        uVar21 = 0;
        local_280 = uVar26;
        do {
          p_Var14 = (_Base_ptr)primitivesB;
          if (iVar27 == 0) {
            p_Var14 = (_Base_ptr)local_2d0._16_8_;
          }
          lVar10 = *(long *)p_Var14;
          lVar15 = uVar21 * 0x40;
          local_1a8 = *(_Link_type *)(lVar10 + 0x24 + lVar15);
          local_1b8 = (undefined1  [8])*(_Base_ptr *)(lVar10 + 0x10 + lVar15);
          _uStack_1b0 = (_Base_ptr)
                        CONCAT44(*(undefined4 *)(lVar10 + 0x20 + lVar15),
                                 *(undefined4 *)(lVar10 + 0x18 + lVar15));
          p_Stack_1a0 = *(_Base_ptr *)(lVar10 + 0x30 + lVar15);
          local_198 = (uchar  [4])*(undefined4 *)(lVar10 + 0x38 + lVar15);
          __x = (_Link_type)CONCAT71((int7)((ulong)local_1a8 >> 8),1);
          uVar17 = 2;
          lVar10 = 0;
          uVar23 = 0;
          do {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = uVar17;
            uVar24 = 0;
            if (lVar10 != 0x18) {
              uVar24 = uVar23 + 1;
            }
            pfVar25 = (float *)(local_1b8 + uVar24 * 0xc);
            fVar3 = *(float *)(local_1b8 + lVar10 + lVar19 * 4);
            if (fVar3 == fVar31) {
              if ((pfVar25[lVar19] == fVar31) && (!NAN(pfVar25[lVar19]) && !NAN(fVar31))) break;
            }
            fVar4 = *(float *)((long)&p_Stack_1a0 +
                              lVar10 + (SUB168(auVar6 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 &
                                       0xfffffffffffffffcU) * -9 + lVar19 * 4);
            if ((fVar4 == fVar31) && (!NAN(fVar4) && !NAN(fVar31))) {
              fVar4 = *(float *)(local_1b8 + lVar10);
              if (((fVar4 != 0.0) || (NAN(fVar4))) && ((fVar4 != 1.0 || (NAN(fVar4))))) {
                fVar4 = *(float *)(local_1b8 + lVar10 + 4);
                if (((fVar4 != 0.0) || (NAN(fVar4))) && ((fVar4 != 1.0 || (NAN(fVar4))))) {
                  fVar4 = *pfVar25;
                  if (((fVar4 != 0.0) || (NAN(fVar4))) && ((fVar4 != 1.0 || (NAN(fVar4))))) {
                    fVar4 = *(float *)(local_1b8 + uVar24 * 0xc + 4);
                    if (((fVar4 != 0.0) || (NAN(fVar4))) && ((fVar4 != 1.0 || (NAN(fVar4))))) {
                      if ((fVar3 == pfVar25[lVar19]) && (!NAN(fVar3) && !NAN(pfVar25[lVar19])))
                      break;
                    }
                  }
                }
              }
            }
            __x = (_Link_type)CONCAT71((int7)((ulong)__x >> 8),uVar23 < 2);
            uVar17 = uVar17 + 1;
            lVar10 = lVar10 + 0xc;
            uVar23 = uVar23 + 1;
          } while (lVar10 != 0x24);
          if ((char)__x != '\0') {
            std::
            __insertion_sort<tcu::Vector<float,3>*,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>>>
                      (local_1b8,local_194);
            __x = (_Link_type)local_1b8;
            std::
            set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
            ::insert(local_278,(value_type *)__x);
            uVar26 = local_280;
            fVar31 = local_288._0_4_;
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar26);
      }
      bVar28 = iVar27 == 0;
      iVar27 = iVar27 + 1;
    } while (bVar28);
    p_Var1 = &local_1e8._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &local_218._M_t._M_impl.super__Rb_tree_header;
    bVar28 = (_Rb_tree_header *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
             p_Var2 && (_Rb_tree_header *)
                       local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1;
    if ((_Rb_tree_header *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var2
        && (_Rb_tree_header *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
           p_Var1) goto LAB_00795fff;
    bVar29 = (_Rb_tree_header *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
             p_Var1;
    bVar30 = (_Rb_tree_header *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
             p_Var2;
    p_Var14 = local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var12 = local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (!bVar29 && !bVar30) {
      while( true ) {
        __x = (_Link_type)(p_Var12 + 1);
        bVar8 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator==
                          ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var14 + 1),
                           (Vector<tcu::Vector<float,_3>,_3> *)__x);
        if (!bVar8) break;
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        p_Var2 = &local_218._M_t._M_impl.super__Rb_tree_header;
        bVar28 = (_Rb_tree_header *)p_Var12 == p_Var2 && (_Rb_tree_header *)p_Var14 == p_Var1;
        if (bVar28) goto LAB_00795fff;
        bVar30 = (_Rb_tree_header *)p_Var12 == p_Var2;
        bVar29 = (_Rb_tree_header *)p_Var14 == p_Var1;
        if ((bVar29) || ((_Rb_tree_header *)p_Var12 == p_Var2)) break;
      }
    }
    local_1b8 = (undefined1  [8])local_2a8._M_left;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1b0,
               "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
               ,0x5a);
    if (p_Var7 == (_Link_type)0x0) {
      plVar11 = &local_2f8;
      puVar18 = &local_300;
      local_308 = plVar11;
    }
    else {
      local_270 = &local_260;
      local_268 = 0;
      local_260 = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
      local_2b8 = &local_2a8;
      p_Var16 = (_Rb_tree_node_base *)(puVar9 + 2);
      if ((_Rb_tree_node_base *)*puVar9 == p_Var16) {
        local_2a8._0_8_ = *(undefined8 *)p_Var16;
        local_2a8._M_parent = (_Base_ptr)puVar9[3];
      }
      else {
        local_2a8._0_8_ = *(undefined8 *)p_Var16;
        local_2b8 = (_Rb_tree_node_base *)*puVar9;
      }
      local_2b0 = puVar9[1];
      *puVar9 = p_Var16;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
      local_308 = &local_2f8;
      plVar11 = puVar9 + 2;
      if ((long *)*puVar9 == plVar11) {
        local_2f8 = *plVar11;
        uStack_2f0 = puVar9[3];
      }
      else {
        local_2f8 = *plVar11;
        local_308 = (long *)*puVar9;
      }
      puVar18 = puVar9 + 1;
      local_300 = puVar9[1];
      *puVar9 = plVar11;
    }
    *puVar18 = 0;
    *(undefined1 *)plVar11 = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1b0,(char *)local_308,local_300);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (p_Var7 != (_Link_type)0x0) {
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8._0_8_ + 1);
      }
      if (local_270 != &local_260) {
        operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
    std::ios_base::~ios_base(local_140);
    if ((bVar29) ||
       ((!bVar30 &&
        (bVar29 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                  ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                                *)(p_Var14 + 1),(Vector<tcu::Vector<float,_3>,_3> *)(p_Var12 + 1),
                               b_00), !bVar29)))) {
      local_1b8 = (undefined1  [8])local_2a8._M_left;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&uStack_1b0,"Note: e.g. triangle ",0x14);
      tcu::operator<<((ostream *)&uStack_1b0,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var12 + 1));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&uStack_1b0," exists for second case but not for first",0x29);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_1b8 = (undefined1  [8])local_2a8._M_left;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&uStack_1b0,"Note: e.g. triangle ",0x14);
      tcu::operator<<((ostream *)&uStack_1b0,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var14 + 1));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&uStack_1b0," exists for first case but not for second",0x29);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  else {
    if (TVar5 != TESSPRIMITIVETYPE_TRIANGLES) {
      return true;
    }
    p_Var14 = (_Base_ptr)
              ((this->super_InvarianceTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    outerEdgeDescriptions(&local_250,TESSPRIMITIVETYPE_TRIANGLES);
    uVar26 = (ulong)outerEdgeNdx;
    tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
              (&local_238,
               local_250.
               super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar26);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,0xb48a65);
    __x = (_Link_type)local_2d0;
    local_2e0 = __x;
    p_Var22 = (_Link_type)(puVar9 + 2);
    if ((_Link_type)*puVar9 == p_Var22) {
      local_2d0._0_8_ = *(long *)&p_Var22->super__Rb_tree_node_base;
      local_2d0._8_8_ = (_Base_ptr)puVar9[3];
    }
    else {
      local_2e0 = (_Link_type)*puVar9;
      local_2d0._0_8_ = *(long *)&p_Var22->super__Rb_tree_node_base;
    }
    local_2d8 = puVar9[1];
    *puVar9 = p_Var22;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_2e8 = local_2e0;
    local_288 = (_Link_type)((long)*(pointer *)(local_2d0._16_8_ + 8) - *(long *)local_2d0._16_8_);
    local_2a8._M_right =
         (_Base_ptr)
         ((long)(primitivesB->
                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                )._M_impl.super__Vector_impl_data._M_finish -
         (long)(primitivesB->
               super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
               )._M_impl.super__Vector_impl_data._M_start);
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1e8._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1e8._M_t._M_impl._0_1_ = 0;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_218._M_t._M_impl.super__Rb_tree_header._M_header;
    local_218._M_t._M_impl._0_1_ = 0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_218._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar19 = uVar26 * 4;
    local_280 = uVar26;
    iVar27 = 0;
    do {
      p_Var22 = (_Link_type)local_2a8._M_right;
      if (iVar27 == 0) {
        p_Var22 = local_288;
      }
      local_278 = &local_218;
      if (iVar27 == 0) {
        local_278 = &local_1e8;
      }
      uVar20 = (uint)((ulong)p_Var22 >> 6);
      if (0 < (int)uVar20) {
        uVar21 = 0;
        do {
          p_Var12 = (_Base_ptr)primitivesB;
          if (iVar27 == 0) {
            p_Var12 = (_Base_ptr)local_2d0._16_8_;
          }
          lVar10 = *(long *)p_Var12;
          lVar15 = uVar21 * 0x40;
          __x = *(_Link_type *)(lVar10 + 0x24 + lVar15);
          local_1b8 = (undefined1  [8])*(_Base_ptr *)(lVar10 + 0x10 + lVar15);
          _uStack_1b0 = (_Base_ptr)
                        CONCAT44(*(undefined4 *)(lVar10 + 0x20 + lVar15),
                                 *(undefined4 *)(lVar10 + 0x18 + lVar15));
          local_1a8 = __x;
          p_Stack_1a0 = *(_Base_ptr *)(lVar10 + 0x30 + lVar15);
          local_198 = (uchar  [4])*(undefined4 *)(lVar10 + 0x38 + lVar15);
          lVar10 = 0;
          bVar28 = false;
          do {
            bVar29 = true;
            if (*(float *)(local_1b8 + lVar10 + lVar19) != 0.0) {
              bVar29 = bVar28;
            }
            if (NAN(*(float *)(local_1b8 + lVar10 + lVar19))) {
              bVar29 = bVar28;
            }
            lVar10 = lVar10 + 0xc;
            bVar28 = bVar29;
          } while (lVar10 != 0x24);
          if (bVar29) {
            local_268 = local_268 & 0xffffffff00000000;
            local_270 = (undefined1 *)0x0;
            lVar10 = 0;
            do {
              *(float *)((long)&local_270 + lVar10 * 4) =
                   *(float *)(local_1b8 + lVar10 * 4) + (&fStack_1ac)[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            local_2b0 = local_2b0 & 0xffffffff00000000;
            local_2b8 = (_Rb_tree_node_base *)0x0;
            lVar10 = 0;
            do {
              *(float *)((long)&local_2b8 + lVar10 * 4) =
                   *(float *)((long)&local_270 + lVar10 * 4) +
                   *(float *)((long)&p_Stack_1a0 + lVar10 * 4);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            local_300 = local_300 & 0xffffffff00000000;
            local_308 = (long *)0x0;
            lVar10 = 0;
            do {
              *(float *)((long)&local_308 + lVar10 * 4) =
                   *(float *)((long)&local_2b8 + lVar10 * 4) / 3.0;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            fVar31 = *(float *)((long)&local_308 + uVar26 * 4);
            if ((fVar31 < *(float *)((long)&local_308 +
                                    (long)(((outerEdgeNdx + 1) / 3) * -3 + outerEdgeNdx + 1) * 4))
               && (fVar31 < *(float *)((long)&local_308 +
                                      (long)(((outerEdgeNdx + 2) / 3) * -3 + outerEdgeNdx + 2) * 4))
               ) {
              std::
              __insertion_sort<tcu::Vector<float,3>*,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>>>
                        (local_1b8,local_194);
              __x = (_Link_type)local_1b8;
              std::
              set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              ::insert(local_278,(value_type *)__x);
              uVar26 = local_280;
            }
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != (uVar20 & 0x7fffffff));
      }
      bVar28 = iVar27 == 0;
      iVar27 = iVar27 + 1;
    } while (bVar28);
    p_Var1 = &local_1e8._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &local_218._M_t._M_impl.super__Rb_tree_header;
    bVar28 = (_Rb_tree_header *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
             p_Var2 && (_Rb_tree_header *)
                       local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1;
    if ((_Rb_tree_header *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var2
        && (_Rb_tree_header *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
           p_Var1) goto LAB_00795fff;
    bVar29 = (_Rb_tree_header *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
             p_Var1;
    bVar30 = (_Rb_tree_header *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
             p_Var2;
    p_Var12 = local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var13 = local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (!bVar29 && !bVar30) {
      while( true ) {
        __x = (_Link_type)(p_Var13 + 1);
        bVar8 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator==
                          ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var12 + 1),
                           (Vector<tcu::Vector<float,_3>,_3> *)__x);
        if (!bVar8) break;
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
        p_Var2 = &local_218._M_t._M_impl.super__Rb_tree_header;
        bVar28 = (_Rb_tree_header *)p_Var13 == p_Var2 && (_Rb_tree_header *)p_Var12 == p_Var1;
        if (bVar28) goto LAB_00795fff;
        bVar30 = (_Rb_tree_header *)p_Var13 == p_Var2;
        bVar29 = (_Rb_tree_header *)p_Var12 == p_Var1;
        if ((bVar29) || ((_Rb_tree_header *)p_Var13 == p_Var2)) break;
      }
    }
    local_1b8 = (undefined1  [8])p_Var14;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1b0,
               "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
               ,0x5a);
    if (local_2e8 == (_Link_type)0x0) {
      plVar11 = &local_2f8;
      puVar18 = &local_300;
      local_308 = plVar11;
    }
    else {
      local_270 = &local_260;
      local_268 = 0;
      local_260 = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_2b8 = &local_2a8;
      p_Var16 = (_Rb_tree_node_base *)(plVar11 + 2);
      if ((_Rb_tree_node_base *)*plVar11 == p_Var16) {
        local_2a8._0_8_ = *(undefined8 *)p_Var16;
        local_2a8._M_parent = (_Base_ptr)plVar11[3];
      }
      else {
        local_2a8._0_8_ = *(undefined8 *)p_Var16;
        local_2b8 = (_Rb_tree_node_base *)*plVar11;
      }
      local_2b0 = plVar11[1];
      *plVar11 = (long)p_Var16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
      local_308 = &local_2f8;
      plVar11 = puVar9 + 2;
      if ((long *)*puVar9 == plVar11) {
        local_2f8 = *plVar11;
        uStack_2f0 = puVar9[3];
      }
      else {
        local_2f8 = *plVar11;
        local_308 = (long *)*puVar9;
      }
      puVar18 = puVar9 + 1;
      local_300 = puVar9[1];
      *puVar9 = plVar11;
    }
    *puVar18 = 0;
    *(undefined1 *)plVar11 = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1b0,(char *)local_308,local_300);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (local_2e8 != (_Link_type)0x0) {
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8._0_8_ + 1);
      }
      if (local_270 != &local_260) {
        operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
    std::ios_base::~ios_base(local_140);
    if ((bVar29) ||
       ((!bVar30 &&
        (bVar29 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                  ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                                *)(p_Var12 + 1),(Vector<tcu::Vector<float,_3>,_3> *)(p_Var13 + 1),b)
        , !bVar29)))) {
      local_1b8 = (undefined1  [8])p_Var14;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&uStack_1b0,"Note: e.g. triangle ",0x14);
      tcu::operator<<((ostream *)&uStack_1b0,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var13 + 1));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&uStack_1b0," exists for second case but not for first",0x29);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_1b8 = (undefined1  [8])p_Var14;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&uStack_1b0,"Note: e.g. triangle ",0x14);
      tcu::operator<<((ostream *)&uStack_1b0,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var12 + 1));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&uStack_1b0," exists for first case but not for second",0x29);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  __x = (_Link_type)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
  std::ios_base::~ios_base(local_140);
LAB_00795fff:
  std::
  _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
  std::
  _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
  if (local_2e0 != (_Link_type)local_2d0) {
    operator_delete(local_2e0,local_2d0._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if (local_250.
      super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar28;
}

Assistant:

bool compare (const PerPrimitiveVec& primitivesA, const PerPrimitiveVec& primitivesB, const int outerEdgeNdx) const
	{
		if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
		{
			return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog(),
									   IsTriangleTriangleOnOuterEdge(outerEdgeNdx),
									   ("inner triangles, and outer triangles corresponding to other edge than edge "
										+ outerEdgeDescriptions(m_caseDef.primitiveType)[outerEdgeNdx].description()).c_str());
		}
		else if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS)
		{
			return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog(),
									   IsQuadTriangleOnOuterEdge(outerEdgeNdx),
									   ("inner triangles, and outer triangles corresponding to other edge than edge "
										+ outerEdgeDescriptions(m_caseDef.primitiveType)[outerEdgeNdx].description()).c_str());
		}
		else
			DE_ASSERT(false);

		return true;
	}